

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O1

uint8_t __thiscall Amiga::Chipset::DiskController::get_rdy_trk0_wpro_chng(DiskController *this)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  Drive *this_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  
  uVar1 = this->previous_select_;
  uVar5 = 0;
  uVar7 = 0;
  if ((uVar1 & 0x40) == 0) {
    uVar7 = *(uint *)&this->field_0x250;
  }
  uVar6 = 0;
  if ((uVar1 & 0x20) == 0) {
    uVar6 = *(uint *)&this->field_0x24c;
  }
  uVar8 = 0;
  if ((uVar1 & 0x10) == 0) {
    uVar8 = *(uint *)&this->field_0x248;
  }
  if ((uVar1 & 8) == 0) {
    uVar5 = *(uint *)&(this->super_Controller).field_0x244;
  }
  this_00 = Storage::Disk::Controller::get_drive(&this->super_Controller);
  bVar2 = Storage::Disk::Drive::get_motor_on(this_00);
  bVar9 = 0x20;
  if (!bVar2) {
    bVar9 = (byte)((uVar7 | uVar6 | uVar8 | uVar5) >> 10) & 0x20;
  }
  bVar2 = Storage::Disk::Drive::get_is_ready(this_00);
  bVar3 = Storage::Disk::Drive::get_is_track_zero(this_00);
  bVar4 = Storage::Disk::Drive::get_is_read_only(this_00);
  return ~(bVar4 << 3 | bVar3 << 4 | bVar9 + !bVar2 * '\x04');
}

Assistant:

uint8_t Chipset::DiskController::get_rdy_trk0_wpro_chng() {
	//	b5:	/RDY
	//	b4:	/TRK0
	//	b3:	/WPRO
	//	b2:	/CHNG

	// My interpretation:
	//
	//	RDY isn't RDY, it's a shift value as described above, combined with the motor state.
	//	CHNG is what is normally RDY.

	const uint32_t combined_id =
		((previous_select_ & 0x40) ? 0 : drive_ids_[3]) |
		((previous_select_ & 0x20) ? 0 : drive_ids_[2]) |
		((previous_select_ & 0x10) ? 0 : drive_ids_[1]) |
		((previous_select_ & 0x08) ? 0 : drive_ids_[0]);

	auto &drive = get_drive();
	const uint8_t active_high =
		((combined_id & 0x8000) >> 10) |
		(drive.get_motor_on() ? 0x20 : 0x00) |
		(drive.get_is_ready() ? 0x00 : 0x04) |
		(drive.get_is_track_zero() ? 0x10 : 0x00) |
		(drive.get_is_read_only() ? 0x08 : 0x00);

	return ~active_high;
}